

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsKeyChordPressed(ImGuiKeyChord key_chord,ImGuiInputFlags flags,ImGuiID owner_id)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiKey IVar3;
  ImGuiKey key;
  
  pIVar1 = GImGui;
  IVar3 = FixupKeyChord(key_chord);
  if ((pIVar1->IO).KeyMods == (IVar3 & ImGuiMod_Mask_)) {
    key = IVar3 & ~ImGuiMod_Mask_;
    if (key == ImGuiKey_KeysData_OFFSET) {
      key = ConvertSingleModFlagToKey(IVar3 & ImGuiMod_Mask_);
    }
    bVar2 = IsKeyPressed(key,flags & 0xff,owner_id);
    return bVar2;
  }
  return false;
}

Assistant:

bool ImGui::IsKeyChordPressed(ImGuiKeyChord key_chord, ImGuiInputFlags flags, ImGuiID owner_id)
{
    ImGuiContext& g = *GImGui;
    key_chord = FixupKeyChord(key_chord);
    ImGuiKey mods = (ImGuiKey)(key_chord & ImGuiMod_Mask_);
    if (g.IO.KeyMods != mods)
        return false;

    // Special storage location for mods
    ImGuiKey key = (ImGuiKey)(key_chord & ~ImGuiMod_Mask_);
    if (key == ImGuiKey_None)
        key = ConvertSingleModFlagToKey(mods);
    if (!IsKeyPressed(key, (flags & ImGuiInputFlags_RepeatMask_), owner_id))
        return false;
    return true;
}